

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  vorbis_dsp_state *v;
  vorbis_block *vb;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ogg_int64_t oVar5;
  byte bVar6;
  int readp;
  long lVar7;
  char cVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  ogg_page og;
  ogg_packet op;
  int local_9c;
  ogg_page local_80;
  ogg_packet local_60;
  
  iVar2 = ov_pcm_seek_page(vf,pos);
  if ((-1 < iVar2) && (iVar2 = _make_decode_ready(vf), iVar2 == 0)) {
    os = &vf->os;
    v = &vf->vd;
    vb = &vf->vb;
    uVar11 = 0;
    do {
      iVar2 = ogg_stream_packetpeek(os,&local_60);
      if (iVar2 < 1) {
        cVar8 = '\x03';
        if ((iVar2 == 0) || (iVar2 == -3)) {
          oVar5 = _get_next_page(vf,&local_80,-1);
          if (-1 < oVar5) {
            iVar2 = ogg_page_bos(&local_80);
            if (iVar2 != 0) {
              vorbis_dsp_clear(v);
              vorbis_block_clear(vb);
              vf->ready_state = 2;
            }
            if (vf->ready_state < 3) {
              iVar2 = ogg_page_serialno(&local_80);
              uVar1 = vf->links;
              if ((int)uVar1 < 1) {
                uVar4 = 0;
              }
              else {
                uVar4 = 0;
                do {
                  if (vf->serialnos[uVar4] == (long)iVar2) goto LAB_001a9082;
                  uVar4 = uVar4 + 1;
                } while (uVar1 != uVar4);
                uVar4 = (ulong)uVar1;
              }
LAB_001a9082:
              if ((uint)uVar4 == uVar1) {
                cVar8 = '\x02';
                bVar12 = false;
                iVar2 = local_9c;
              }
              else {
                vf->current_link = (uint)uVar4;
                vf->ready_state = 3;
                iVar3 = ogg_page_serialno(&local_80);
                vf->current_serialno = (long)iVar3;
                ogg_stream_reset_serialno(os,iVar2);
                iVar2 = _make_decode_ready(vf);
                bVar12 = iVar2 == 0;
                cVar8 = !bVar12;
                if (bVar12) {
                  uVar11 = 0;
                  iVar2 = local_9c;
                }
              }
              local_9c = iVar2;
              if (!bVar12) goto LAB_001a90f0;
            }
            ogg_stream_pagein(os,&local_80);
            cVar8 = '\0';
          }
        }
      }
      else {
        uVar4 = vorbis_packet_blocksize(vf->vi + vf->current_link,&local_60);
        iVar2 = (int)uVar4;
        if (iVar2 < 0) {
          ogg_stream_packetout(os,(ogg_packet *)0x0);
          cVar8 = '\x02';
        }
        else {
          if ((int)uVar11 != 0) {
            vf->pcm_offset = vf->pcm_offset + (ulong)((uint)((int)uVar11 + iVar2) >> 2);
          }
          lVar7 = vf->pcm_offset;
          iVar3 = vorbis_info_blocksize(vf->vi,1);
          cVar8 = '\x03';
          if ((iVar3 + iVar2 >> 2) + lVar7 < pos) {
            ogg_stream_packetout(os,(ogg_packet *)0x0);
            vorbis_synthesis_trackonly(vb,&local_60);
            vorbis_synthesis_blockin(v,vb);
            if (-1 < local_60.granulepos) {
              lVar9 = (long)vf->current_link;
              lVar7 = local_60.granulepos - vf->pcmlengths[lVar9 * 2];
              if (lVar7 < 1) {
                lVar7 = 0;
              }
              vf->pcm_offset = lVar7;
              if (0 < lVar9) {
                lVar7 = vf->pcm_offset;
                lVar10 = 0;
                do {
                  lVar7 = lVar7 + *(long *)((long)vf->pcmlengths + lVar10 + 8);
                  vf->pcm_offset = lVar7;
                  lVar10 = lVar10 + 0x10;
                } while (lVar9 * 0x10 != lVar10);
              }
            }
            cVar8 = '\0';
            uVar11 = uVar4 & 0xffffffff;
          }
        }
      }
LAB_001a90f0:
    } while ((cVar8 == '\0') || (cVar8 == '\x02'));
    iVar2 = local_9c;
    if (cVar8 == '\x03') {
      vf->bittrack = 0.0;
      vf->samptrack = 0.0;
      iVar2 = vorbis_synthesis_halfrate_p(vf->vi);
      bVar6 = (byte)iVar2;
      lVar7 = vf->pcm_offset;
      while (lVar7 < (long)(((ulong)pos >> (bVar6 & 0x3f)) << (bVar6 & 0x3f))) {
        lVar10 = pos - lVar7 >> (bVar6 & 0x3f);
        iVar3 = vorbis_synthesis_pcmout(v,(float ***)0x0);
        lVar9 = (long)iVar3;
        lVar7 = lVar9;
        if (lVar10 < lVar9) {
          lVar7 = lVar10;
        }
        vorbis_synthesis_read(v,(int)lVar7);
        vf->pcm_offset = vf->pcm_offset + (lVar7 << (bVar6 & 0x3f));
        if ((lVar9 < lVar10) &&
           (iVar3 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,readp,iVar2), iVar3 < 1)) {
          oVar5 = ov_pcm_total(vf,-1);
          vf->pcm_offset = oVar5;
        }
        lVar7 = vf->pcm_offset;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos){
  int thisblock,lastblock=0;
  int ret=ov_pcm_seek_page(vf,pos);
  if(ret<0)return(ret);
  if((ret=_make_decode_ready(vf)))return ret;

  /* discard leading packets we don't need for the lapping of the
     position we want; don't decode them */

  while(1){
    ogg_packet op;
    ogg_page og;

    int ret=ogg_stream_packetpeek(&vf->os,&op);
    if(ret>0){
      thisblock=vorbis_packet_blocksize(vf->vi+vf->current_link,&op);
      if(thisblock<0){
        ogg_stream_packetout(&vf->os,NULL);
        continue; /* non audio packet */
      }
      if(lastblock)vf->pcm_offset+=(lastblock+thisblock)>>2;

      if(vf->pcm_offset+((thisblock+
                          vorbis_info_blocksize(vf->vi,1))>>2)>=pos)break;

      /* remove the packet from packet queue and track its granulepos */
      ogg_stream_packetout(&vf->os,NULL);
      vorbis_synthesis_trackonly(&vf->vb,&op);  /* set up a vb with
                                                   only tracking, no
                                                   pcm_decode */
      vorbis_synthesis_blockin(&vf->vd,&vf->vb);

      /* end of logical stream case is hard, especially with exact
         length positioning. */

      if(op.granulepos>-1){
        int i;
        /* always believe the stream markers */
        vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
        if(vf->pcm_offset<0)vf->pcm_offset=0;
        for(i=0;i<vf->current_link;i++)
          vf->pcm_offset+=vf->pcmlengths[i*2+1];
      }

      lastblock=thisblock;

    }else{
      if(ret<0 && ret!=OV_HOLE)break;

      /* suck in a new page */
      if(_get_next_page(vf,&og,-1)<0)break;
      if(ogg_page_bos(&og))_decode_clear(vf);

      if(vf->ready_state<STREAMSET){
        long serialno=ogg_page_serialno(&og);
        int link;

        for(link=0;link<vf->links;link++)
          if(vf->serialnos[link]==serialno)break;
        if(link==vf->links) continue;
        vf->current_link=link;

        vf->ready_state=STREAMSET;
        vf->current_serialno=ogg_page_serialno(&og);
        ogg_stream_reset_serialno(&vf->os,serialno);
        ret=_make_decode_ready(vf);
        if(ret)return ret;
        lastblock=0;
      }

      ogg_stream_pagein(&vf->os,&og);
    }
  }

  vf->bittrack=0.f;
  vf->samptrack=0.f;
  /* discard samples until we reach the desired position. Crossing a
     logical bitstream boundary with abandon is OK. */
  {
    /* note that halfrate could be set differently in each link, but
       vorbisfile encoforces all links are set or unset */
    int hs=vorbis_synthesis_halfrate_p(vf->vi);
    while(vf->pcm_offset<((pos>>hs)<<hs)){
      ogg_int64_t target=(pos-vf->pcm_offset)>>hs;
      long samples=vorbis_synthesis_pcmout(&vf->vd,NULL);

      if(samples>target)samples=target;
      vorbis_synthesis_read(&vf->vd,samples);
      vf->pcm_offset+=samples<<hs;

      if(samples<target)
        if(_fetch_and_process_packet(vf,NULL,1,1)<=0)
          vf->pcm_offset=ov_pcm_total(vf,-1); /* eof */
    }
  }
  return 0;
}